

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

AsmJsCodeGenerator * __thiscall Js::ScriptContext::InitAsmJsCodeGenerator(ScriptContext *this)

{
  HeapAllocator *alloc;
  AsmJsCodeGenerator *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  this_00 = this->asmJsCodeGenerator;
  if (this_00 == (AsmJsCodeGenerator *)0x0) {
    local_48 = (undefined1  [8])&AsmJsCodeGenerator::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename._0_4_ = 0x56e;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (AsmJsCodeGenerator *)new<Memory::HeapAllocator>(0x90,alloc,0x2f6726);
    AsmJsCodeGenerator::AsmJsCodeGenerator(this_00,this);
    this->asmJsCodeGenerator = this_00;
  }
  return this_00;
}

Assistant:

AsmJsCodeGenerator* ScriptContext::InitAsmJsCodeGenerator()
    {
        if( !asmJsCodeGenerator )
        {
            asmJsCodeGenerator = HeapNew( AsmJsCodeGenerator, this );
        }
        return asmJsCodeGenerator;
    }